

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::MLTIntegrator::L
          (MLTIntegrator *this,ScratchBuffer *scratchBuffer,MLTSampler *sampler,int depth,
          Point2f *pRaster,SampledWavelengths *lambda)

{
  Tuple2<pbrt::Point2,_float> TVar1;
  CameraSample sample;
  bool bVar2;
  int iVar3;
  Array path;
  CameraRayDifferential *pCVar4;
  Array path_00;
  Tuple2<pbrt::Point2,_float> *pTVar5;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  TVar6;
  int maxDepth;
  uintptr_t iptr;
  Float FVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined8 uVar20;
  undefined1 auVar17 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 in_register_00001284 [12];
  Bounds2f BVar22;
  SampledSpectrum SVar23;
  int local_170;
  Float local_16c;
  undefined1 local_158 [16];
  optional<pbrt::Point2<float>_> pRasterNew;
  SampledSpectrum L;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  ulong local_f8;
  uintptr_t local_f0;
  uintptr_t local_e8;
  uintptr_t local_e0;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_d8;
  SamplerHandle local_d0;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_c8;
  SamplerHandle local_c0;
  optional<pbrt::CameraRayDifferential> crd;
  SampledSpectrum local_40;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar16 [56];
  undefined1 auVar21 [56];
  
  uVar20 = in_ZMM1._12_8_;
  MLTSampler::StartStream(sampler,0);
  if (depth == 0) {
    local_170 = 0;
    maxDepth = 2;
    local_16c = 1.0;
  }
  else {
    FVar7 = MLTSampler::Get1D(sampler);
    local_16c = (Float)(depth + 2);
    local_170 = depth + 1;
    if ((int)(FVar7 * local_16c) <= depth + 1) {
      local_170 = (int)(FVar7 * local_16c);
    }
    maxDepth = (depth + 2) - local_170;
  }
  if (*(char *)(Options + 6) == '\x01') {
    FVar7 = 0.5;
  }
  else {
    FVar7 = MLTSampler::Get1D(sampler);
  }
  SampledWavelengths::SampleXYZ((SampledWavelengths *)&crd,FVar7);
  *(anon_struct_8_0_00000001_for___align *)(lambda->lambda).values = crd.optionalValue.__align;
  *(undefined8 *)((lambda->lambda).values + 2) = crd.optionalValue._8_8_;
  *(undefined8 *)(lambda->pdf).values = crd.optionalValue._16_8_;
  *(undefined8 *)((lambda->pdf).values + 2) = crd.optionalValue._24_8_;
  local_158._8_8_ = crd.optionalValue._8_8_;
  path = ScratchBuffer::Alloc<pbrt::Vertex[]>(scratchBuffer,(long)maxDepth);
  crd.optionalValue.__align =
       *(anon_struct_8_0_00000001_for___align *)
        (((this->camera).
          super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
          .bits & 0xffffffffffff) + 0x340);
  BVar22 = TaggedPointer<pbrt::RGBFilm,pbrt::GBufferFilm>::
           Dispatch<pbrt::FilmHandle::SampleBounds()const::_lambda(auto:1)_1_>();
  local_158._0_4_ = BVar22.pMin.super_Tuple2<pbrt::Point2,_float>.x;
  local_158._4_4_ = BVar22.pMin.super_Tuple2<pbrt::Point2,_float>.y;
  auVar12._0_8_ = MLTSampler::Get2D(sampler);
  auVar12._8_56_ = extraout_var;
  auVar17._8_4_ = 0x3f800000;
  auVar17._0_8_ = 0x3f8000003f800000;
  auVar17._12_4_ = 0x3f800000;
  auVar17 = vsubps_avx(auVar17,auVar12._0_16_);
  local_128 = BVar22.pMax.super_Tuple2<pbrt::Point2,_float>.x;
  fStack_124 = BVar22.pMax.super_Tuple2<pbrt::Point2,_float>.y;
  fStack_120 = (float)uVar20;
  fStack_11c = (float)((ulong)uVar20 >> 0x20);
  auVar9._0_4_ = auVar12._0_4_ * local_128;
  auVar9._4_4_ = auVar12._4_4_ * fStack_124;
  auVar9._8_4_ = extraout_var._0_4_ * fStack_120;
  auVar9._12_4_ = extraout_var._4_4_ * fStack_11c;
  auVar17 = vfmadd231ps_fma(auVar9,auVar17,local_158);
  TVar1 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar17);
  pRaster->super_Tuple2<pbrt::Point2,_float> = TVar1;
  FVar7 = MLTSampler::Get1D(sampler);
  auVar13._0_8_ = MLTSampler::Get2D(sampler);
  auVar13._8_56_ = extraout_var_00;
  auVar17 = vmovlhps_avx(auVar17,auVar13._0_16_);
  sample.time._0_1_ = SUB41(FVar7,0);
  sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)auVar17._0_8_;
  sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)((ulong)auVar17._0_8_ >> 0x20);
  sample.pLens.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)auVar17._8_8_;
  sample.pLens.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)((ulong)auVar17._8_8_ >> 0x20);
  sample._17_7_ = (int7)(CONCAT44(0x3f800000,FVar7) >> 8);
  CameraHandle::GenerateRayDifferential(&crd,&this->camera,sample,lambda);
  if (crd.set == true) {
    pCVar4 = pstd::optional<pbrt::CameraRayDifferential>::value(&crd);
    bVar2 = SampledSpectrum::operator_cast_to_bool(&pCVar4->weight);
    if (bVar2) {
      auVar10._0_4_ = (float)sampler->mutationsPerPixel;
      auVar10._4_12_ = in_register_00001284;
      auVar21 = ZEXT856(0);
      if (auVar10._0_4_ < 0.0) {
        auVar21 = ZEXT856(0);
        fVar8 = sqrtf(auVar10._0_4_);
      }
      else {
        auVar17 = vsqrtss_avx(auVar10,auVar10);
        fVar8 = auVar17._0_4_;
      }
      pCVar4 = pstd::optional<pbrt::CameraRayDifferential>::value(&crd);
      auVar11._0_4_ = 1.0 / fVar8;
      auVar11._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar17 = vmaxss_avx(auVar11,ZEXT416(0x3e000000));
      RayDifferential::ScaleDifferentials(&pCVar4->ray,auVar17._0_4_);
      pCVar4 = pstd::optional<pbrt::CameraRayDifferential>::value(&crd);
      TVar6.bits = (ulong)sampler | 0x8000000000000;
      local_c8.bits =
           (this->camera).
           super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
           .bits;
      local_c0.
      super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
      .bits = (TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
               )(TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 )TVar6.bits;
      iVar3 = GenerateCameraSubpath
                        (&this->super_Integrator,&pCVar4->ray,lambda,&local_c0,scratchBuffer,
                         maxDepth,(CameraHandle *)&local_c8,path,this->regularize);
      if (iVar3 == maxDepth) {
        MLTSampler::StartStream(sampler,1);
        path_00 = ScratchBuffer::Alloc<pbrt::Vertex[]>(scratchBuffer,(long)local_170);
        local_d8.bits =
             (this->camera).
             super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
             .bits;
        local_e0 = (this->lightSampler).
                   super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                   .bits;
        auVar16 = (undefined1  [56])0x0;
        local_d0.
        super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
        .bits = (TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 )(TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                   )TVar6.bits;
        iVar3 = GenerateLightSubpath
                          (&this->super_Integrator,lambda,&local_d0,(CameraHandle *)&local_d8,
                           scratchBuffer,local_170,(path->field_2).ei.super_Interaction.time,
                           (LightSamplerHandle)&local_e0,path_00,this->regularize);
        if (iVar3 == local_170) {
          MLTSampler::StartStream(sampler,2);
          pRasterNew.set = false;
          local_e8 = (this->lightSampler).
                     super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                     .bits;
          local_f0 = (this->camera).
                     super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                     .bits;
          local_f8 = TVar6.bits;
          SVar23 = ConnectBDPT(&this->super_Integrator,lambda,path_00,path,local_170,maxDepth,
                               (LightSamplerHandle)&local_e8,(CameraHandle)&local_f0,
                               (SamplerHandle)&local_f8,&pRasterNew,(Float *)0x0);
          auVar18._0_8_ = SVar23.values.values._8_8_;
          auVar18._8_56_ = auVar21;
          auVar14._0_8_ = SVar23.values.values._0_8_;
          auVar14._8_56_ = auVar16;
          local_40.values.values = (array<float,_4>)vmovlhps_avx(auVar14._0_16_,auVar18._0_16_);
          auVar16 = (undefined1  [56])0x0;
          SVar23 = SampledSpectrum::operator*(&local_40,local_16c);
          auVar19._0_8_ = SVar23.values.values._8_8_;
          auVar19._8_56_ = auVar21;
          auVar15._0_8_ = SVar23.values.values._0_8_;
          auVar15._8_56_ = auVar16;
          L.values.values = (array<float,_4>)vmovlhps_avx(auVar15._0_16_,auVar19._0_16_);
          if (pRasterNew.set == true) {
            pTVar5 = &pstd::optional<pbrt::Point2<float>_>::value(&pRasterNew)->
                      super_Tuple2<pbrt::Point2,_float>;
            pRaster->super_Tuple2<pbrt::Point2,_float> = *pTVar5;
          }
          pstd::optional<pbrt::Point2<float>_>::~optional(&pRasterNew);
        }
        else {
          SampledSpectrum::SampledSpectrum(&L,0.0);
        }
      }
      else {
        SampledSpectrum::SampledSpectrum(&L,0.0);
      }
      goto LAB_00420d4f;
    }
  }
  SampledSpectrum::SampledSpectrum(&L,0.0);
LAB_00420d4f:
  pstd::optional<pbrt::CameraRayDifferential>::~optional(&crd);
  return (SampledSpectrum)L.values;
}

Assistant:

SampledSpectrum MLTIntegrator::L(ScratchBuffer &scratchBuffer, MLTSampler &sampler,
                                 int depth, Point2f *pRaster,
                                 SampledWavelengths *lambda) {
    sampler.StartStream(cameraStreamIndex);
    // Determine the number of available strategies and pick a specific one
    int s, t, nStrategies;
    if (depth == 0) {
        nStrategies = 1;
        s = 0;
        t = 2;
    } else {
        nStrategies = depth + 2;
        s = std::min<int>(sampler.Get1D() * nStrategies, nStrategies - 1);
        t = nStrategies - s;
    }

    // Sample wavelengths for MLT path
    if (Options->disableWavelengthJitter)
        *lambda = camera.GetFilm().SampleWavelengths(0.5);
    else
        *lambda = camera.GetFilm().SampleWavelengths(sampler.Get1D());

    // Generate a camera subpath with exactly _t_ vertices
    Vertex *cameraVertices = scratchBuffer.Alloc<Vertex[]>(t);
    // Compute camera sample for MLT camera path
    Bounds2f sampleBounds = camera.GetFilm().SampleBounds();
    *pRaster = sampleBounds.Lerp(sampler.Get2D());
    CameraSample cameraSample;
    cameraSample.pFilm = *pRaster;
    cameraSample.time = sampler.Get1D();
    cameraSample.pLens = sampler.Get2D();

    // Generate camera ray for MLT camera path
    pstd::optional<CameraRayDifferential> crd =
        camera.GenerateRayDifferential(cameraSample, *lambda);
    if (!crd || !crd->weight)
        return SampledSpectrum(0.f);
    Float rayDiffScale =
        std::max<Float>(.125, 1 / std::sqrt((Float)sampler.SamplesPerPixel()));
    crd->ray.ScaleDifferentials(rayDiffScale);

    if (GenerateCameraSubpath(*this, crd->ray, *lambda, &sampler, scratchBuffer, t,
                              camera, cameraVertices, regularize) != t)
        return SampledSpectrum(0.f);

    // Generate a light subpath with exactly _s_ vertices
    sampler.StartStream(lightStreamIndex);
    Vertex *lightVertices = scratchBuffer.Alloc<Vertex[]>(s);
    if (GenerateLightSubpath(*this, *lambda, &sampler, camera, scratchBuffer, s,
                             cameraVertices[0].time(), lightSampler, lightVertices,
                             regularize) != s)
        return SampledSpectrum(0.f);

    // Execute connection strategy and return the radiance estimate
    sampler.StartStream(connectionStreamIndex);
    pstd::optional<Point2f> pRasterNew;
    SampledSpectrum L = ConnectBDPT(*this, *lambda, lightVertices, cameraVertices, s, t,
                                    lightSampler, camera, &sampler, &pRasterNew) *
                        nStrategies;
    if (pRasterNew)
        *pRaster = *pRasterNew;
    return L;
}